

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
cxxpool::
get<std::vector<unsigned_long,std::allocator<unsigned_long>>,__gnu_cxx::__normal_iterator<std::future<unsigned_long>*,std::vector<std::future<unsigned_long>,std::allocator<std::future<unsigned_long>>>>,void>
          (__normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
           first,__normal_iterator<std::future<unsigned_long>_*,_std::vector<std::future<unsigned_long>,_std::allocator<std::future<unsigned_long>_>_>_>
                 last,vector<unsigned_long,_std::allocator<unsigned_long>_> *result)

{
  unsigned_long local_30;
  
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    local_30 = std::future<unsigned_long>::get(first._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (result,&local_30);
  }
  return result;
}

Assistant:

inline
Result &get(Iterator first, Iterator last, Result &result) {
    for (; first != last; ++first)
        result.push_back(first->get());
    return result;
}